

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void __thiscall
wasm::SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer::
visitLocalGet(wasm::LocalGet__(void *this,LocalGet *curr)

{
  _Rb_tree_color index;
  int iVar1;
  long lVar2;
  Function *pFVar3;
  LocalGet *pLVar4;
  bool bVar5;
  uint uVar6;
  iterator iVar7;
  Type TVar8;
  Type TVar9;
  _Rb_tree_node_base *p_Var10;
  uint uVar11;
  _Rb_tree_color index_00;
  _Rb_tree_node_base *p_Var12;
  Index local_54;
  _Rb_tree_node_base *local_50;
  Function *local_48;
  void *local_40;
  LocalGet *local_38;
  
  local_54 = curr->index;
  local_40 = this;
  iVar7 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)((long)this + 0x1b0),&local_54);
  if ((iVar7.
       super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (lVar2 = *(long *)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_false>
                              ._M_cur + 0x10), lVar2 == 0)) {
    return;
  }
  p_Var10 = *(_Rb_tree_node_base **)(lVar2 + 0x18);
  p_Var12 = (_Rb_tree_node_base *)(lVar2 + 8);
  local_38 = curr;
  if (p_Var10 == p_Var12) goto LAB_00b0df0a;
  local_48 = *(Function **)((long)local_40 + 200);
  index_00 = ~_S_red;
  local_50 = p_Var12;
LAB_00b0dd69:
  pFVar3 = local_48;
  index = p_Var10[1]._M_color;
  if (index_00 != ~_S_red) {
    TVar8 = Function::getLocalType(local_48,index_00);
    TVar9 = Function::getLocalType(pFVar3,index);
    bVar5 = wasm::Type::isSubType(TVar9,TVar8);
    p_Var12 = local_50;
    if (!bVar5) goto LAB_00b0ddf2;
    if (TVar9.id == TVar8.id) {
      uVar6 = *(uint *)(**(long **)((long)local_40 + 0xe0) + (ulong)index * 4);
      if (local_38->index == index) {
        if (uVar6 == 0) goto LAB_00b0deeb;
        uVar6 = uVar6 - 1;
      }
      uVar11 = *(uint *)(**(long **)((long)local_40 + 0xe0) + (ulong)index_00 * 4);
      if (local_38->index == index_00) {
        if (uVar11 == 0) goto LAB_00b0deeb;
        uVar11 = uVar11 - 1;
      }
      if (uVar6 <= uVar11) goto LAB_00b0ddf2;
    }
  }
  index_00 = index;
LAB_00b0ddf2:
  p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
  pFVar3 = local_48;
  if (p_Var10 == p_Var12) goto code_r0x00b0de06;
  goto LAB_00b0dd69;
code_r0x00b0de06:
  if (index_00 == ~_S_red) {
LAB_00b0df0a:
    __assert_fail("best != Index(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                  ,0x450,
                  "void wasm::SimplifyLocals<>::runLateOptimizations(Function *)::EquivalentOptimizer::visitLocalGet(LocalGet *) [allowTee = true, allowStructure = true, allowNesting = true]"
                 );
  }
  TVar8 = Function::getLocalType(local_48,index_00);
  pLVar4 = local_38;
  TVar9 = Function::getLocalType(pFVar3,local_38->index);
  if (index_00 == pLVar4->index) {
    return;
  }
  bVar5 = wasm::Type::isSubType(TVar8,TVar9);
  if (!bVar5) {
    return;
  }
  lVar2 = **(long **)((long)local_40 + 0xe0);
  uVar11 = *(uint *)(lVar2 + (ulong)index_00 * 4);
  uVar6 = uVar11;
  if (local_38->index == index_00) {
    if (uVar11 == 0) goto LAB_00b0deeb;
    uVar6 = uVar11 - 1;
  }
  iVar1 = *(int *)(lVar2 + (ulong)local_38->index * 4);
  if (iVar1 != 0) {
    if ((uVar6 <= iVar1 - 1U) && (TVar8.id == TVar9.id)) {
      return;
    }
    *(uint *)(lVar2 + (ulong)index_00 * 4) = uVar11 + 1;
    iVar1 = *(int *)(lVar2 + (ulong)local_38->index * 4);
    if (iVar1 == 0) {
      __assert_fail("(*numLocalGets)[curr->index] >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x45d,
                    "void wasm::SimplifyLocals<>::runLateOptimizations(Function *)::EquivalentOptimizer::visitLocalGet(LocalGet *) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    *(int *)(lVar2 + (ulong)local_38->index * 4) = iVar1 + -1;
    local_38->index = index_00;
    *(undefined1 *)((long)local_40 + 0x1a8) = 1;
    if (TVar8.id == TVar9.id) {
      return;
    }
    TVar8 = Function::getLocalType(local_48,index_00);
    (local_38->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         TVar8.id;
    *(undefined1 *)((long)local_40 + 0x1a9) = 1;
    return;
  }
LAB_00b0deeb:
  __assert_fail("ret >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                ,0x42e,
                "auto wasm::SimplifyLocals<>::runLateOptimizations(Function *)::EquivalentOptimizer::visitLocalGet(LocalGet *)::(anonymous class)::operator()(Index) const [allowTee = true, allowStructure = true, allowNesting = true]"
               );
}

Assistant:

void visitLocalGet(LocalGet* curr) {
        // Canonicalize gets: if some are equivalent, then we can pick more
        // then one, and other passes may benefit from having more uniformity.
        if (auto* set = equivalences.getEquivalents(curr->index)) {
          // Helper method that returns the # of gets *ignoring the current
          // get*, as we want to see what is best overall, treating this one as
          // to be decided upon.
          auto getNumGetsIgnoringCurr = [&](Index index) {
            auto ret = (*numLocalGets)[index];
            if (index == curr->index) {
              assert(ret >= 1);
              ret--;
            }
            return ret;
          };

          // Pick the index with the most uses - maximizing the chance to
          // lower one's uses to zero. If types differ though then we prefer to
          // switch to a more refined type even if there are fewer uses, as that
          // may have significant benefits to later optimizations (we may be
          // able to use it to remove casts, etc.).
          auto* func = this->getFunction();
          Index best = -1;
          for (auto index : *set) {
            if (best == Index(-1)) {
              // This is the first possible option we've seen.
              best = index;
              continue;
            }

            auto bestType = func->getLocalType(best);
            auto addressType = func->getLocalType(index);
            if (!Type::isSubType(addressType, bestType)) {
              // This is less refined than the current best; ignore.
              continue;
            }

            // This is better if it has a more refined type, or if it has more
            // uses.
            if (addressType != bestType ||
                getNumGetsIgnoringCurr(index) > getNumGetsIgnoringCurr(best)) {
              best = index;
            }
          }
          assert(best != Index(-1));
          // Due to ordering, the best index may be different from us but have
          // the same # of locals - make sure we actually improve, either adding
          // more gets, or a more refined type (and never change to a less
          // refined type).
          auto bestType = func->getLocalType(best);
          auto oldType = func->getLocalType(curr->index);
          if (best != curr->index && Type::isSubType(bestType, oldType)) {
            auto hasMoreGets = getNumGetsIgnoringCurr(best) >
                               getNumGetsIgnoringCurr(curr->index);
            if (hasMoreGets || bestType != oldType) {
              // Update the get counts.
              (*numLocalGets)[best]++;
              assert((*numLocalGets)[curr->index] >= 1);
              (*numLocalGets)[curr->index]--;
              // Make the change.
              curr->index = best;
              anotherCycle = true;
              if (bestType != oldType) {
                curr->type = func->getLocalType(best);
                // We are switching to a more refined type, which might require
                // changes in the user of the local.get.
                refinalize = true;
              }
            }
          }
        }
      }